

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O3

void palette_rd_y(AV1_COMP *cpi,MACROBLOCK *x,MB_MODE_INFO *mbmi,BLOCK_SIZE bsize,int dc_mode_cost,
                 int16_t *data,int16_t *centroids,int n,uint16_t *color_cache,int n_cache,
                 _Bool do_header_rd_based_gating,MB_MODE_INFO *best_mbmi,
                 uint8_t *best_palette_color_map,int64_t *best_rd,int *rate,int *rate_tokenonly,
                 int64_t *distortion,uint8_t *skippable,int *beat_best_rd,PICK_MODE_CONTEXT *ctx,
                 uint8_t *blk_skip,uint8_t *tx_type_map,int *beat_best_palette_rd,
                 _Bool *do_header_rd_based_breakout,int discount_color_cost)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  ushort uVar4;
  aom_bit_depth_t aVar5;
  SequenceHeader *pSVar6;
  uint8_t *__src;
  MB_MODE_INFO *pMVar7;
  WinnerModeStats *pWVar8;
  byte bVar9;
  long lVar10;
  int64_t *piVar11;
  ushort uVar12;
  uint uVar13;
  uint8_t *puVar14;
  size_t __n;
  uint16_t uVar15;
  long lVar16;
  byte bVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  byte bVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  uint8_t *__dest;
  ulong uVar27;
  bool bVar28;
  RD_STATS tokenonly_rd_stats;
  RD_STATS local_58;
  
  if (do_header_rd_based_breakout != (_Bool *)0x0) {
    *do_header_rd_based_breakout = false;
  }
  if (0 < n_cache) {
    if (n < 1) {
      qsort(centroids,(long)n,2,int16_comparer);
      return;
    }
    aVar5 = ((cpi->common).seq_params)->bit_depth;
    uVar20 = 0;
    do {
      iVar25 = (int)centroids[uVar20] - (uint)*color_cache;
      iVar24 = -iVar25;
      if (0 < iVar25) {
        iVar24 = iVar25;
      }
      if (n_cache == 1) {
        lVar16 = 0;
      }
      else {
        iVar25 = 0;
        uVar27 = 1;
        iVar22 = iVar24;
        do {
          iVar24 = (int)centroids[uVar20] - (uint)color_cache[uVar27];
          iVar23 = -iVar24;
          if (0 < iVar24) {
            iVar23 = iVar24;
          }
          iVar24 = iVar23;
          if (iVar22 <= iVar23) {
            iVar24 = iVar22;
          }
          if (iVar23 < iVar22) {
            iVar25 = (int)uVar27;
          }
          uVar27 = uVar27 + 1;
          iVar22 = iVar24;
        } while ((uint)n_cache != uVar27);
        lVar16 = (long)iVar25;
      }
      if (iVar24 <= 4 << ((char)aVar5 - 8U & 0x1f)) {
        centroids[uVar20] = color_cache[lVar16];
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != (uint)n);
  }
  qsort(centroids,(long)n,2,int16_comparer);
  if (n < 2) {
    return;
  }
  uVar19 = 1;
  uVar20 = 1;
  do {
    if (centroids[uVar20] != centroids[uVar20 - 1]) {
      lVar16 = (long)(int)uVar19;
      uVar19 = uVar19 + 1;
      centroids[lVar16] = centroids[uVar20];
    }
    uVar20 = uVar20 + 1;
  } while ((uint)n != uVar20);
  if ((int)uVar19 < 2) {
    return;
  }
  pSVar6 = (cpi->common).seq_params;
  if (pSVar6->use_highbitdepth == '\0') {
    uVar20 = 0;
    do {
      uVar15 = centroids[uVar20];
      if (centroids[uVar20] < 1) {
        uVar15 = 0;
      }
      if (0xfe < (short)uVar15) {
        uVar15 = 0xff;
      }
      (mbmi->palette_mode_info).palette_colors[uVar20] = uVar15;
      uVar20 = uVar20 + 1;
    } while (uVar19 != uVar20);
  }
  else {
    aVar5 = pSVar6->bit_depth;
    uVar20 = 0;
    do {
      uVar4 = centroids[uVar20];
      if (aVar5 == AOM_BITS_10) {
        bVar28 = uVar4 < 0x3ff;
        uVar12 = 0x3ff;
      }
      else if (aVar5 == AOM_BITS_12) {
        bVar28 = uVar4 < 0xfff;
        uVar12 = 0xfff;
      }
      else {
        bVar28 = uVar4 < 0xff;
        uVar12 = 0xff;
      }
      if (bVar28) {
        uVar12 = uVar4;
      }
      if ((short)uVar4 < 0) {
        uVar12 = 0;
      }
      (mbmi->palette_mode_info).palette_colors[uVar20] = uVar12;
      uVar20 = uVar20 + 1;
    } while (uVar19 != uVar20);
  }
  (mbmi->palette_mode_info).palette_size[0] = (uint8_t)uVar19;
  bVar1 = block_size_high[bsize];
  bVar2 = block_size_wide[bsize];
  iVar24 = (x->e_mbd).mb_to_bottom_edge;
  iVar25 = (x->e_mbd).mb_to_right_edge;
  bVar17 = (byte)(x->e_mbd).plane[0].subsampling_x;
  bVar21 = (byte)(x->e_mbd).plane[0].subsampling_y;
  uVar18 = (uint)(bVar2 >> (bVar17 & 0x1f));
  bVar9 = bVar1 >> (bVar21 & 0x1f);
  uVar26 = (int)((iVar24 >> 0x1f & iVar24 >> 3) + (uint)bVar1) >> (bVar21 & 0x1f);
  uVar13 = (int)((iVar25 >> 0x1f & iVar25 >> 3) + (uint)bVar2) >> (bVar17 & 0x1f);
  __src = (x->e_mbd).plane[0].color_index_map;
  (*av1_calc_indices_dim1)(data,centroids,__src,(int64_t *)0x0,uVar13 * uVar26,uVar19);
  if ((bVar9 != uVar26) || (uVar18 != uVar13)) {
    uVar20 = (ulong)uVar18;
    if (0 < (int)uVar26) {
      __n = (size_t)(int)uVar13;
      uVar27 = (ulong)uVar26 + 1;
      lVar16 = (ulong)uVar26 - 1;
      puVar14 = __src + lVar16 * __n;
      __dest = __src + lVar16 * uVar20;
      do {
        memmove(__dest,puVar14,__n);
        memset(__dest + __n,(uint)__dest[__n - 1],(long)(int)(uVar18 - uVar13));
        uVar27 = uVar27 - 1;
        puVar14 = puVar14 + -__n;
        __dest = __dest + -uVar20;
      } while (1 < uVar27);
    }
    if ((int)uVar26 < (int)(uint)bVar9) {
      lVar16 = (ulong)bVar9 - (long)(int)uVar26;
      puVar14 = __src + (long)(int)uVar26 * uVar20;
      do {
        memcpy(puVar14,__src + (int)((uVar26 - 1) * uVar18),uVar20);
        puVar14 = puVar14 + uVar20;
        lVar16 = lVar16 + -1;
      } while (lVar16 != 0);
    }
  }
  if (do_header_rd_based_gating) {
    iVar25 = intra_mode_info_cost_y(cpi,x,mbmi,bsize,dc_mode_cost,discount_color_cost);
    if (*best_rd <
        ((long)x->rdmult * (long)iVar25 + 0x100 >> 9) >>
        ((cpi->sf).intra_sf.prune_luma_palette_size_search_level == 1)) {
      *do_header_rd_based_breakout = true;
      return;
    }
    av1_pick_uniform_tx_size_type_yrd(cpi,x,&local_58,bsize,*best_rd);
    if (local_58.rate == 0x7fffffff) {
      return;
    }
    iVar25 = local_58.rate + iVar25;
  }
  else {
    av1_pick_uniform_tx_size_type_yrd(cpi,x,&local_58,bsize,*best_rd);
    iVar24 = local_58.rate;
    if (local_58.rate == 0x7fffffff) {
      return;
    }
    iVar25 = intra_mode_info_cost_y(cpi,x,mbmi,bsize,dc_mode_cost,discount_color_cost);
    iVar25 = iVar25 + iVar24;
  }
  lVar16 = local_58.dist * 0x80 + ((long)x->rdmult * (long)iVar25 + 0x100 >> 9);
  if (((x->e_mbd).lossless[*(ushort *)&mbmi->field_0xa7 & 7] == 0) && (mbmi->bsize != BLOCK_4X4)) {
    iVar24 = 0;
    if ((bsize != BLOCK_4X4) && (iVar24 = 0, (x->txfm_search_params).tx_mode_search_type == '\x02'))
    {
      lVar10 = 0;
      for (bVar17 = ""[bsize]; bVar17 != mbmi->tx_size; bVar17 = ""[bVar17]) {
        lVar10 = lVar10 + 1;
      }
      bVar28 = (x->e_mbd).up_available;
      bVar3 = (x->e_mbd).left_available;
      bVar17 = *(x->e_mbd).above_txfm_context;
      if ((bVar28 == true) &&
         ((pMVar7 = (x->e_mbd).above_mbmi, (pMVar7->field_0xa7 & 0x80) != 0 ||
          ('\0' < pMVar7->ref_frame[0])))) {
        bVar17 = block_size_wide[pMVar7->bsize];
      }
      bVar21 = *(x->e_mbd).left_txfm_context;
      if ((bVar3 != false) &&
         ((pMVar7 = (x->e_mbd).left_mbmi, (pMVar7->field_0xa7 & 0x80) != 0 ||
          ('\0' < pMVar7->ref_frame[0])))) {
        bVar21 = block_size_high[pMVar7->bsize];
      }
      iVar24 = *(int *)((long)(x->mode_costs).skip_txfm_cost +
                       lVar10 * 4 +
                       (ulong)(byte)(bVar28 & tx_size_wide[""[(*(x->e_mbd).mi)->bsize]] <=
                                              (int)(uint)bVar17) * 0x14 +
                       (ulong)(byte)(bVar3 & tx_size_high[""[(*(x->e_mbd).mi)->bsize]] <=
                                             (int)(uint)bVar21) * 0x14 +
                       (ulong)(byte)bsize_to_tx_size_cat_bsize_to_tx_size_depth_table[bsize] * 0x3c
                       + -0x24);
    }
    local_58.rate = local_58.rate - iVar24;
  }
  uVar20 = (ulong)(cpi->sf).winner_mode_sf.multi_winner_mode_type;
  if ((lVar16 != 0x7fffffffffffffff && uVar20 != 0) &&
     ((pWVar8 = x->winner_mode_stats, ((cpi->common).current_frame.frame_type & 0xfd) == 0 ||
      ((mbmi->palette_mode_info).palette_size[0] == '\0')))) {
    uVar19 = winner_mode_count_allowed[uVar20];
    uVar13 = x->winner_mode_count;
    if ((ulong)uVar13 == 0) {
      uVar20 = 0;
    }
    else {
      if ((int)uVar13 < 1) {
        uVar20 = 0;
      }
      else {
        piVar11 = &pWVar8->rd;
        uVar20 = 0;
        do {
          if (lVar16 < *piVar11) goto LAB_001ea175;
          uVar20 = uVar20 + 1;
          piVar11 = piVar11 + 0x81e;
        } while (uVar13 != uVar20);
        uVar20 = (ulong)uVar13;
      }
LAB_001ea175:
      uVar13 = (uint)uVar20;
      if (uVar13 == uVar19) goto LAB_001ea244;
      if ((int)uVar13 < (int)(uVar19 - 1)) {
        memmove(pWVar8 + (uVar20 & 0xffffffff) + 1,pWVar8 + (uVar20 & 0xffffffff),
                (long)(int)(~uVar13 + uVar19) * 0x40f0);
      }
    }
    uVar20 = uVar20 & 0xffffffff;
    memcpy(pWVar8 + uVar20,mbmi,0xb0);
    pWVar8[uVar20].rd = lVar16;
    pWVar8[uVar20].mode_index = 0x9c;
    if (__src != (uint8_t *)0x0) {
      memcpy(pWVar8[uVar20].color_index_map,__src,
             (ulong)((uint)(bVar1 >> ((byte)(x->e_mbd).plane[0].subsampling_y & 0x1f)) *
                    (uint)(bVar2 >> ((byte)(x->e_mbd).plane[0].subsampling_x & 0x1f))));
    }
    uVar13 = x->winner_mode_count + 1;
    if ((int)uVar19 <= (int)uVar13) {
      uVar13 = uVar19;
    }
    x->winner_mode_count = uVar13;
  }
LAB_001ea244:
  if (lVar16 < *best_rd) {
    *best_rd = lVar16;
    if (beat_best_rd != (int *)0x0) {
      *beat_best_rd = 1;
    }
    memcpy(best_palette_color_map,__src,(ulong)(bVar9 * uVar18));
    memcpy(best_mbmi,mbmi,0xb0);
    memcpy(blk_skip,(x->txfm_search_info).blk_skip,(long)ctx->num_4x4_blk);
    memcpy(tx_type_map,(x->e_mbd).tx_type_map,(long)ctx->num_4x4_blk);
    if (rate != (int *)0x0) {
      *rate = iVar25;
    }
    if (rate_tokenonly != (int *)0x0) {
      *rate_tokenonly = local_58.rate;
    }
    if (distortion != (int64_t *)0x0) {
      *distortion = local_58.dist;
    }
    if (skippable != (uint8_t *)0x0) {
      *skippable = local_58.skip_txfm;
    }
    if (beat_best_palette_rd != (int *)0x0) {
      *beat_best_palette_rd = 1;
    }
  }
  return;
}

Assistant:

static inline void palette_rd_y(
    const AV1_COMP *const cpi, MACROBLOCK *x, MB_MODE_INFO *mbmi,
    BLOCK_SIZE bsize, int dc_mode_cost, const int16_t *data, int16_t *centroids,
    int n, uint16_t *color_cache, int n_cache, bool do_header_rd_based_gating,
    MB_MODE_INFO *best_mbmi, uint8_t *best_palette_color_map, int64_t *best_rd,
    int *rate, int *rate_tokenonly, int64_t *distortion, uint8_t *skippable,
    int *beat_best_rd, PICK_MODE_CONTEXT *ctx, uint8_t *blk_skip,
    uint8_t *tx_type_map, int *beat_best_palette_rd,
    bool *do_header_rd_based_breakout, int discount_color_cost) {
  if (do_header_rd_based_breakout != NULL) *do_header_rd_based_breakout = false;
  optimize_palette_colors(color_cache, n_cache, n, 1, centroids,
                          cpi->common.seq_params->bit_depth);
  const int num_unique_colors = remove_duplicates(centroids, n);
  if (num_unique_colors < PALETTE_MIN_SIZE) {
    // Too few unique colors to create a palette. And DC_PRED will work
    // well for that case anyway. So skip.
    return;
  }
  PALETTE_MODE_INFO *const pmi = &mbmi->palette_mode_info;
  if (cpi->common.seq_params->use_highbitdepth) {
    for (int i = 0; i < num_unique_colors; ++i) {
      pmi->palette_colors[i] = clip_pixel_highbd(
          (int)centroids[i], cpi->common.seq_params->bit_depth);
    }
  } else {
    for (int i = 0; i < num_unique_colors; ++i) {
      pmi->palette_colors[i] = clip_pixel(centroids[i]);
    }
  }
  pmi->palette_size[0] = num_unique_colors;
  MACROBLOCKD *const xd = &x->e_mbd;
  uint8_t *const color_map = xd->plane[0].color_index_map;
  int block_width, block_height, rows, cols;
  av1_get_block_dimensions(bsize, 0, xd, &block_width, &block_height, &rows,
                           &cols);
  av1_calc_indices(data, centroids, color_map, rows * cols, num_unique_colors,
                   1);
  extend_palette_color_map(color_map, cols, rows, block_width, block_height);

  RD_STATS tokenonly_rd_stats;
  int this_rate;

  if (do_header_rd_based_gating) {
    assert(do_header_rd_based_breakout != NULL);
    const int palette_mode_rate = intra_mode_info_cost_y(
        cpi, x, mbmi, bsize, dc_mode_cost, discount_color_cost);
    const int64_t header_rd = RDCOST(x->rdmult, palette_mode_rate, 0);
    // Less aggressive pruning when prune_luma_palette_size_search_level == 1.
    const int header_rd_shift =
        (cpi->sf.intra_sf.prune_luma_palette_size_search_level == 1) ? 1 : 0;
    // Terminate further palette_size search, if the header cost corresponding
    // to lower palette_size is more than *best_rd << header_rd_shift. This
    // logic is implemented with a right shift in the LHS to prevent a possible
    // overflow with the left shift in RHS.
    if ((header_rd >> header_rd_shift) > *best_rd) {
      *do_header_rd_based_breakout = true;
      return;
    }
    av1_pick_uniform_tx_size_type_yrd(cpi, x, &tokenonly_rd_stats, bsize,
                                      *best_rd);
    if (tokenonly_rd_stats.rate == INT_MAX) return;
    this_rate = tokenonly_rd_stats.rate + palette_mode_rate;
  } else {
    av1_pick_uniform_tx_size_type_yrd(cpi, x, &tokenonly_rd_stats, bsize,
                                      *best_rd);
    if (tokenonly_rd_stats.rate == INT_MAX) return;
    this_rate = tokenonly_rd_stats.rate +
                intra_mode_info_cost_y(cpi, x, mbmi, bsize, dc_mode_cost,
                                       discount_color_cost);
  }

  int64_t this_rd = RDCOST(x->rdmult, this_rate, tokenonly_rd_stats.dist);
  if (!xd->lossless[mbmi->segment_id] && block_signals_txsize(mbmi->bsize)) {
    tokenonly_rd_stats.rate -= tx_size_cost(x, bsize, mbmi->tx_size);
  }
  // Collect mode stats for multiwinner mode processing
  const int txfm_search_done = 1;
  store_winner_mode_stats(
      &cpi->common, x, mbmi, NULL, NULL, NULL, THR_DC, color_map, bsize,
      this_rd, cpi->sf.winner_mode_sf.multi_winner_mode_type, txfm_search_done);
  if (this_rd < *best_rd) {
    *best_rd = this_rd;
    // Setting beat_best_rd flag because current mode rd is better than best_rd.
    // This flag need to be updated only for palette evaluation in key frames
    if (beat_best_rd) *beat_best_rd = 1;
    memcpy(best_palette_color_map, color_map,
           block_width * block_height * sizeof(color_map[0]));
    *best_mbmi = *mbmi;
    memcpy(blk_skip, x->txfm_search_info.blk_skip,
           sizeof(x->txfm_search_info.blk_skip[0]) * ctx->num_4x4_blk);
    av1_copy_array(tx_type_map, xd->tx_type_map, ctx->num_4x4_blk);
    if (rate) *rate = this_rate;
    if (rate_tokenonly) *rate_tokenonly = tokenonly_rd_stats.rate;
    if (distortion) *distortion = tokenonly_rd_stats.dist;
    if (skippable) *skippable = tokenonly_rd_stats.skip_txfm;
    if (beat_best_palette_rd) *beat_best_palette_rd = 1;
  }
}